

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::SolverParameter::set_snapshot_format
          (SolverParameter *this,SolverParameter_SnapshotFormat value)

{
  uint32 *puVar1;
  
  if (value < 2) {
    puVar1 = (this->_has_bits_).has_bits_ + 1;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
    this->snapshot_format_ = value;
    return;
  }
  __assert_fail("::caffe::SolverParameter_SnapshotFormat_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                ,0x351e,
                "void caffe::SolverParameter::set_snapshot_format(::caffe::SolverParameter_SnapshotFormat)"
               );
}

Assistant:

bool SolverParameter_SnapshotFormat_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}